

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::ElementInstanceList::ParseInstanceList
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               Element *pcElement,ElementInstanceList *p_pcOut,PLYImporter *loader)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  char *pCur;
  ElementInstance elt;
  pointer local_58;
  PLYImporter *local_50;
  ElementInstance local_48;
  
  local_50 = loader;
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x2a2,
                  "static bool Assimp::PLY::ElementInstanceList::ParseInstanceList(IOStreamBuffer<char> &, std::vector<char> &, const PLY::Element *, PLY::ElementInstanceList *, PLYImporter *)"
                 );
  }
  if ((pcElement->eSemantic == EEST_INVALID) ||
     ((pcElement->alProperties).
      super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pcElement->alProperties).
      super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (pcElement->NumOccur != 0) {
      uVar2 = 0;
      do {
        DOM::SkipComments(buffer);
        DOM::SkipLine(buffer);
        IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
        uVar2 = uVar2 + 1;
      } while (uVar2 < pcElement->NumOccur);
    }
  }
  else {
    local_58 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (pcElement->NumOccur != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        if (p_pcOut == (ElementInstanceList *)0x0) {
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ElementInstance::ParseInstance(&local_58,pcElement,&local_48);
          if (pcElement->eSemantic - EEST_Face < 2) {
            PLYImporter::LoadFace(local_50,pcElement,&local_48,(uint)uVar3);
          }
          else if (pcElement->eSemantic == EEST_Vertex) {
            PLYImporter::LoadVertex(local_50,pcElement,&local_48,(uint)uVar3);
          }
          std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ::~vector(&local_48.alProperties);
        }
        else {
          ElementInstance::ParseInstance
                    (&local_58,pcElement,
                     (ElementInstance *)
                     ((long)&(((p_pcOut->alInstances).
                               super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                               ._M_impl.super__Vector_impl_data._M_start)->alProperties).
                             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                     + lVar4));
        }
        IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
        pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_58 = (pointer)0x0;
        if (pcVar1 != (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          local_58 = pcVar1;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar3 < pcElement->NumOccur);
    }
  }
  return true;
}

Assistant:

bool PLY::ElementInstanceList::ParseInstanceList(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const PLY::Element* pcElement,
  PLY::ElementInstanceList* p_pcOut,
  PLYImporter* loader)
{
  ai_assert(NULL != pcElement);

  // parse all elements
  if (EEST_INVALID == pcElement->eSemantic || pcElement->alProperties.empty())
  {
    // if the element has an unknown semantic we can skip all lines
    // However, there could be comments
    for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
    {
      PLY::DOM::SkipComments(buffer);
      PLY::DOM::SkipLine(buffer);
      streamBuffer.getNextLine(buffer);
    }
  }
  else
  {
    const char* pCur = (const char*)&buffer[0];
    // be sure to have enough storage
    for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
    {
      if (p_pcOut)
        PLY::ElementInstance::ParseInstance(pCur, pcElement, &p_pcOut->alInstances[i]);
      else
      {
        ElementInstance elt;
        PLY::ElementInstance::ParseInstance(pCur, pcElement, &elt);

        // Create vertex or face
        if (pcElement->eSemantic == EEST_Vertex)
        {
          //call loader instance from here
          loader->LoadVertex(pcElement, &elt, i);
        }
        else if (pcElement->eSemantic == EEST_Face)
        {
          //call loader instance from here
          loader->LoadFace(pcElement, &elt, i);
        }
        else if (pcElement->eSemantic == EEST_TriStrip)
        {
          //call loader instance from here
          loader->LoadFace(pcElement, &elt, i);
        }
      }

      streamBuffer.getNextLine(buffer);
      pCur = (buffer.empty()) ? NULL : (const char*)&buffer[0];
    }
  }
  return true;
}